

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_subface.c
# Opt level: O0

void prf_push_subface_entry_f(prf_node_t *node,prf_state_t *state)

{
  long in_RSI;
  ushort *in_RDI;
  
  if (*in_RDI == prf_push_subface_info.opcode) {
    *(short *)(in_RSI + 0x78) = *(short *)(in_RSI + 0x78) + 1;
  }
  else {
    prf_error(9,"tried push subface entry state method on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_push_subface_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_push_subface_info.opcode ) {
        prf_error( 9,
            "tried push subface entry state method on node of type %d.",
            node->opcode );
        return;
    }

    state->subface_level++;
}